

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_definitions.hpp
# Opt level: O3

double units::detail::convertTemperature<units::unit,units::precise_unit>
                 (double val,unit *start,precise_unit *result)

{
  float fVar1;
  double dVar2;
  bool bVar3;
  double dVar4;
  unit local_18;
  
  if (((uint)start->base_units_ & 0x4fffffff) == 0x40010000) {
    local_18 = *start;
    bVar3 = unit::operator==((unit *)&degF,&local_18);
    if (bVar3) {
      val = ((val + -32.0) * 5.0) / 9.0;
    }
    else {
      fVar1 = start->multiplier_;
      if ((fVar1 != 1.0) || (NAN(fVar1))) {
        if ((29.5 <= fVar1) || (fVar1 < 0.0)) {
          val = val * (double)fVar1;
        }
        else {
          val = val * (double)fVar1 +
                convertTemperature<units::unit,_units::precise_unit>::biasTable._M_elems[(int)fVar1]
          ;
        }
      }
    }
    dVar4 = val + 273.15;
  }
  else {
    dVar4 = val * (double)start->multiplier_;
  }
  if (((uint)result->base_units_ & 0x4fffffff) == 0x40010000) {
    dVar4 = dVar4 + -273.15;
    local_18.base_units_ = result->base_units_;
    local_18.multiplier_ = (float)result->multiplier_;
    bVar3 = unit::operator==((unit *)&degF,&local_18);
    if (bVar3) {
      dVar4 = dVar4 * 1.8 + 32.0;
    }
    else {
      dVar2 = result->multiplier_;
      if ((dVar2 != 1.0) || (NAN(dVar2))) {
        if ((dVar2 < 29.5) && (0.0 <= dVar2)) {
          dVar4 = dVar4 - convertTemperature<units::unit,_units::precise_unit>::biasTable._M_elems
                          [(int)dVar2];
        }
        dVar4 = dVar4 / dVar2;
      }
    }
  }
  else {
    dVar4 = dVar4 / result->multiplier_;
  }
  return dVar4;
}

Assistant:

double convertTemperature(double val, const UX& start, const UX2& result)
    {
        static constexpr std::array<double, 30> biasTable{
            0.0, 0.0, 0.0, 0.0, 0.0,   0.0,   0.0, 0.0,     0.0, 0.0,
            0.0, 0.0, 0.0, 0.0, 121.0, 0.0,   0.0, 0.0,     0.0, 0.0,
            0.0, 0.0, 0.0, 0.0, 0.0,   150.0, 0.0, 37.7778, 0.0, 0.0};

        if (is_temperature(start)) {
            if (units::degF == unit_cast(start)) {
                val = (val - 32.0) * 5.0 / 9.0;
            } else if (start.multiplier() != 1.0) {
                if (start.multiplier() < 29.5 && start.multiplier() >= 0.0) {
                    val = val * start.multiplier() +
                        biasTable[static_cast<int>(start.multiplier())];
                } else {
                    val = val * start.multiplier();
                }
            }
            val += 273.15;
            // convert to K
        } else {
            val = val * start.multiplier();
        }
        if (is_temperature(result)) {
            val -= 273.15;
            if (units::degF == unit_cast(result)) {
                val *= 9.0 / 5.0;
                val += 32.0;
            } else if (result.multiplier() != 1.0) {
                if (result.multiplier() < 29.5 && result.multiplier() >= 0.0) {
                    val = (val -
                           biasTable[static_cast<int>(result.multiplier())]) /
                        result.multiplier();
                } else {
                    val = val / result.multiplier();
                }
            }
            return val;
        }
        return val / result.multiplier();
    }